

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O0

bool verona::lookup_type(NodeRange *n,initializer_list<trieste::Token> t)

{
  bool bVar1;
  reference psVar2;
  size_type in_RCX;
  initializer_list<trieste::Token> t_00;
  shared_ptr<trieste::NodeDef> local_30;
  NodeRange *local_20;
  NodeRange *n_local;
  initializer_list<trieste::Token> t_local;
  
  t_local._M_array = (iterator)t._M_len;
  n_local = (NodeRange *)t._M_array;
  local_20 = n;
  psVar2 = __gnu_cxx::
           __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
           ::operator*(&n->first);
  ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_30,psVar2);
  t_00._M_len = in_RCX;
  t_00._M_array = t_local._M_array;
  bVar1 = lookup_type((verona *)&local_30,(Node *)n_local,t_00);
  ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_30);
  return bVar1;
}

Assistant:

bool lookup_type(const NodeRange& n, std::initializer_list<Token> t)
  {
    return lookup_type(*n.first, t);
  }